

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O0

void __thiscall QWidgetPrivate::enforceNativeChildren(QWidgetPrivate *this)

{
  bool bVar1;
  pointer pQVar2;
  QObject *o;
  qsizetype qVar3;
  QWidget *pQVar4;
  QWidgetPrivate *in_RDI;
  QWidget *child;
  int i;
  bool in_stack_00000043;
  WidgetAttribute in_stack_00000044;
  QWidget *in_stack_00000048;
  int local_c;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x38b730);
  if (!bVar1) {
    createExtra(in_RDI);
  }
  pQVar2 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x38b74c);
  if ((*(ushort *)&pQVar2->field_0x7c >> 5 & 1) == 0) {
    pQVar2 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x38b773);
    *(ushort *)&pQVar2->field_0x7c = *(ushort *)&pQVar2->field_0x7c & 0xffdf | 0x20;
    local_c = 0;
    while( true ) {
      o = (QObject *)(long)local_c;
      qVar3 = QList<QObject_*>::size((QList<QObject_*> *)&in_RDI->field_0x18);
      if (qVar3 <= (long)o) break;
      QList<QObject_*>::at((QList<QObject_*> *)in_RDI,(qsizetype)o);
      pQVar4 = qobject_cast<QWidget*>(o);
      if (pQVar4 != (QWidget *)0x0) {
        QWidget::setAttribute(in_stack_00000048,in_stack_00000044,in_stack_00000043);
      }
      local_c = local_c + 1;
    }
  }
  return;
}

Assistant:

inline void enforceNativeChildren()
    {
        if (!extra)
            createExtra();

        if (extra->nativeChildrenForced)
            return;
        extra->nativeChildrenForced = 1;

        for (int i = 0; i < children.size(); ++i) {
            if (QWidget *child = qobject_cast<QWidget *>(children.at(i)))
                child->setAttribute(Qt::WA_NativeWindow);
        }
    }